

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int delete_extra(int argc,char **argv)

{
  FILE *__stream;
  zip_flags_t zVar1;
  int iVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  undefined8 uVar5;
  zip_uint64_t idx;
  zip_uint16_t eid;
  zip_flags_t geflags;
  char **argv_local;
  int argc_local;
  
  uVar3 = strtoull(*argv,(char **)0x0,10);
  uVar4 = strtoull(argv[1],(char **)0x0,10);
  zVar1 = get_flags(argv[2]);
  iVar2 = zip_file_extra_field_delete(za,uVar3,uVar4 & 0xffff,zVar1);
  __stream = _stderr;
  if (iVar2 < 0) {
    uVar5 = zip_strerror(za);
    fprintf(__stream,
            "can\'t delete extra field data for file at index \'%lu\', extra field id \'%d\': %s\n",
            uVar3,uVar4 & 0xffff,uVar5);
    argv_local._4_4_ = -1;
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int
delete_extra(int argc, char *argv[]) {
    zip_flags_t geflags;
    zip_uint16_t eid;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    eid = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    geflags = get_flags(argv[2]);
    if ((zip_file_extra_field_delete(za, idx, eid, geflags)) < 0) {
	fprintf(stderr, "can't delete extra field data for file at index '%" PRIu64 "', extra field id '%d': %s\n", idx, eid, zip_strerror(za));
	return -1;
    }
    return 0;
}